

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O0

void __thiscall
FormatTest_OutputIterators_Test::~FormatTest_OutputIterators_Test
          (FormatTest_OutputIterators_Test *this)

{
  void *in_RDI;
  
  ~FormatTest_OutputIterators_Test((FormatTest_OutputIterators_Test *)0x1a06d8);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(FormatTest, OutputIterators) {
  std::list<char> out;
  fmt::format_to(std::back_inserter(out), "{}", 42);
  EXPECT_EQ("42", std::string(out.begin(), out.end()));
  std::stringstream s;
  fmt::format_to(std::ostream_iterator<char>(s), "{}", 42);
  EXPECT_EQ("42", s.str());
}